

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

UniquePtr<SSL_CTX> __thiscall
bssl::anon_unknown_0::CreateContextWithTestCertificate(anon_unknown_0 *this,SSL_METHOD *method)

{
  int iVar1;
  UniquePtr<SSL_CTX> extraout_RAX;
  UniquePtr<SSL_CTX> ctx;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<X509> cert;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_20;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_18;
  _Head_base<0UL,_x509_st_*,_false> local_10;
  
  local_20._M_head_impl = (ssl_ctx_st *)SSL_CTX_new((SSL_METHOD *)method);
  CertFromPEM((anon_unknown_0 *)&local_10,
              "-----BEGIN CERTIFICATE-----\nMIICWDCCAcGgAwIBAgIJAPuwTC6rEJsMMA0GCSqGSIb3DQEBBQUAMEUxCzAJBgNV\nBAYTAkFVMRMwEQYDVQQIDApTb21lLVN0YXRlMSEwHwYDVQQKDBhJbnRlcm5ldCBX\naWRnaXRzIFB0eSBMdGQwHhcNMTQwNDIzMjA1MDQwWhcNMTcwNDIyMjA1MDQwWjBF\nMQswCQYDVQQGEwJBVTETMBEGA1UECAwKU29tZS1TdGF0ZTEhMB8GA1UECgwYSW50\nZXJuZXQgV2lkZ2l0cyBQdHkgTHRkMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCBiQKB\ngQDYK8imMuRi/03z0K1Zi0WnvfFHvwlYeyK9Na6XJYaUoIDAtB92kWdGMdAQhLci\nHnAjkXLI6W15OoV3gA/ElRZ1xUpxTMhjP6PyY5wqT5r6y8FxbiiFKKAnHmUcrgfV\nW28tQ+0rkLGMryRtrukXOgXBv7gcrmU7G1jC2a7WqmeI8QIDAQABo1AwTjAdBgNV\nHQ4EFgQUi3XVrMsIvg4fZbf6Vr5sp3Xaha8wHwYDVR0jBBgwFoAUi3XVrMsIvg4f\nZbf6Vr5sp3Xaha8wDAYDVR0TBAUwAwEB/zANBgkqhkiG9w0BAQUFAAOBgQA76Hht\nldY9avcTGSwbwoiuIqv0jTL1fHFnzy3RHMLDh+Lpvolc5DSrSJHCP5WuK0eeJXhr\nT5oQpHL9z/cCDLAKCKRa4uV0fhEdOWBqyR9p8y5jJtye72t6CuFUV5iqcpF4BH4f\nj2VNHwsSrJwkD4QUGlUtH7vwnQmyCFxZMmWAJg==\n-----END CERTIFICATE-----\n"
             );
  KeyFromPEM((anon_unknown_0 *)&local_18,(anonymous_namespace)::GetTestKey()::kKeyPEM);
  if (((local_20._M_head_impl != (ssl_ctx_st *)0x0) &&
      ((X509 *)local_10._M_head_impl != (X509 *)0x0)) &&
     ((EVP_PKEY *)local_18._M_head_impl != (EVP_PKEY *)0x0)) {
    iVar1 = SSL_CTX_use_certificate((SSL_CTX *)local_20._M_head_impl,(X509 *)local_10._M_head_impl);
    if (iVar1 != 0) {
      iVar1 = SSL_CTX_use_PrivateKey
                        ((SSL_CTX *)local_20._M_head_impl,(EVP_PKEY *)local_18._M_head_impl);
      if (iVar1 != 0) {
        *(ssl_ctx_st **)this = local_20._M_head_impl;
        local_20._M_head_impl = (ssl_ctx_st *)0x0;
        goto LAB_00167a6b;
      }
    }
  }
  *(undefined8 *)this = 0;
LAB_00167a6b:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_18);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_10);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_20);
  return (UniquePtr<SSL_CTX>)
         extraout_RAX._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<SSL_CTX> CreateContextWithTestCertificate(
    const SSL_METHOD *method) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(method));
  bssl::UniquePtr<X509> cert = GetTestCertificate();
  bssl::UniquePtr<EVP_PKEY> key = GetTestKey();
  if (!ctx || !cert || !key ||
      !SSL_CTX_use_certificate(ctx.get(), cert.get()) ||
      !SSL_CTX_use_PrivateKey(ctx.get(), key.get())) {
    return nullptr;
  }
  return ctx;
}